

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:565:59)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:565:59)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  bool bVar1;
  uint32_t uVar2;
  value *pvVar3;
  undefined8 *puVar4;
  object *this_00;
  long *plVar5;
  long *plVar6;
  uint32_t index;
  uint32_t index_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar7;
  pointer pvVar8;
  uint uVar9;
  anon_class_16_1_570cf4e1_for_f *this_01;
  pointer pvVar10;
  anon_union_32_5_7b1e0779_for_value_3 *this_02;
  wstring this_idx;
  wstring last_idx;
  undefined1 local_108 [16];
  undefined1 local_f8 [24];
  undefined1 local_e0 [32];
  wstring local_c0;
  value *local_a0;
  pointer local_98;
  gc_heap *local_90;
  vector<mjs::value,_std::allocator<mjs::value>_> *local_88;
  ulong local_80;
  gc_heap_ptr_untyped *local_78;
  gc_heap *local_70;
  pointer local_68;
  wstring_view local_60;
  gc_heap_ptr_untyped local_50;
  
  this_01 = &this->f;
  pvVar3 = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
  global_object::validate_object((global_object *)&stack0xffffffffffffffc0,pvVar3);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffc0);
  if (this_->type_ == object) {
    this_02 = &this_->field_1;
    local_90 = (this_01->global).super_gc_heap_ptr_untyped.heap_;
    puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_02->s_);
    local_c0._M_dataplus._M_p = (pointer)0x6;
    local_c0._M_string_length = 0x18f7b8;
    (**(code **)*puVar4)(local_108,puVar4);
    uVar2 = to_uint32((value *)local_108);
    local_a0 = __return_storage_ptr__;
    local_78 = (gc_heap_ptr_untyped *)this_01;
    value::destroy((value *)local_108);
    pvVar8 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pvVar10 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    local_98 = (pointer)(ulong)(uint)((int)((ulong)((long)pvVar10 - (long)pvVar8) >> 3) *
                                     -0x33333333);
    local_80 = (ulong)uVar2;
    if (uVar2 != 0) {
      uVar7 = extraout_RDX;
      local_88 = args;
      do {
        uVar2 = uVar2 - 1;
        index_string_abi_cxx11_(&local_c0,(mjs *)(ulong)uVar2,(uint32_t)uVar7);
        index_string_abi_cxx11_((wstring *)local_e0,(mjs *)(ulong)((int)local_98 + uVar2),index);
        this_00 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_02->s_);
        local_108._0_8_ = local_c0._M_string_length;
        local_108._8_8_ = local_c0._M_dataplus._M_p;
        bVar1 = object::has_property(this_00,(wstring_view *)local_108);
        if (bVar1) {
          plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_02->s_);
          local_60._M_len = local_e0._8_8_;
          local_60._M_str = (wchar_t *)local_e0._0_8_;
          string::string((string *)&local_50,local_90,&local_60);
          puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_02->s_);
          local_70 = (gc_heap *)local_c0._M_string_length;
          local_68 = local_c0._M_dataplus._M_p;
          (**(code **)*puVar4)(local_108,puVar4,&local_70);
          (**(code **)(*plVar5 + 8))(plVar5,&local_50,local_108,0);
          value::destroy((value *)local_108);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_50);
          uVar7 = extraout_RDX_00;
        }
        else {
          plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_02->s_);
          local_108._0_8_ = local_e0._8_8_;
          local_108._8_8_ = local_e0._0_8_;
          (**(code **)(*plVar5 + 0x10))(plVar5,local_108);
          uVar7 = extraout_RDX_01;
        }
        if ((gc_heap *)local_e0._0_8_ != (gc_heap *)(local_e0 + 0x10)) {
          operator_delete((void *)local_e0._0_8_,local_e0._16_8_ * 4 + 4);
          uVar7 = extraout_RDX_02;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity * 4 + 4);
          uVar7 = extraout_RDX_03;
        }
      } while (uVar2 != 0);
      pvVar8 = (local_88->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pvVar10 = (local_88->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    }
    if (pvVar8 != pvVar10) {
      uVar9 = 0;
      do {
        plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_02->s_);
        index_string_abi_cxx11_((wstring *)local_108,(mjs *)(ulong)uVar9,index_00);
        local_e0._0_8_ = local_108._8_8_;
        local_e0._8_8_ = local_108._0_8_;
        string::string((string *)&local_c0,local_90,(wstring_view *)local_e0);
        (**(code **)(*plVar5 + 8))(plVar5,&local_c0,pvVar8,0);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c0);
        if ((gc_heap *)local_108._0_8_ != (gc_heap *)local_f8) {
          operator_delete((void *)local_108._0_8_,local_f8._0_8_ * 4 + 4);
        }
        pvVar8 = pvVar8 + 1;
        uVar9 = uVar9 + 1;
      } while (pvVar8 != pvVar10);
    }
    pvVar3 = local_a0;
    local_a0->type_ = number;
    (local_a0->field_1).n_ = (double)(uint)((int)local_80 + (int)local_98);
    plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_02->s_);
    plVar6 = (long *)gc_heap_ptr_untyped::get(local_78);
    (**(code **)(*plVar6 + 0x98))(local_108,plVar6,"length");
    (**(code **)(*plVar5 + 8))(plVar5,local_108,pvVar3,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_108);
    return pvVar3;
  }
  __assert_fail("type_ == value_type::object",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",0x46
                ,"const object_ptr &mjs::value::object_value() const");
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }